

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  byte bVar18;
  uint uVar19;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar20) [32];
  long lVar21;
  byte bVar22;
  byte bVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined4 uVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_25dc;
  RayQueryContext *local_25d8;
  Scene *local_25d0;
  undefined1 local_25c8 [16];
  Geometry *local_25b8;
  long local_25b0;
  ulong *local_25a8;
  long local_25a0;
  RTCFilterFunctionNArguments local_2598;
  float local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  undefined4 local_255c;
  undefined4 local_2558;
  undefined4 local_2554;
  uint local_2550;
  uint local_254c;
  uint local_2548;
  undefined1 local_2538 [16];
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined1 local_2518 [32];
  undefined1 local_24f8 [32];
  undefined1 local_24d8 [32];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  byte local_2477;
  float local_2468 [4];
  float local_2458 [4];
  undefined1 local_2448 [16];
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  undefined1 local_2418 [16];
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25d8 = context;
    local_25a8 = local_2368;
    local_2370[0] = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar40 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar88 = ZEXT1664(auVar40);
    auVar41 = vmaxss_avx512f(auVar40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar69 = (ray->super_RayK<1>).tfar;
    auVar74 = ZEXT464((uint)fVar69);
    auVar42 = vmaxss_avx512f(auVar40,ZEXT416((uint)fVar69));
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar43 = vandps_avx512vl((undefined1  [16])aVar3,auVar43);
    auVar46._8_4_ = 0x219392ef;
    auVar46._0_8_ = 0x219392ef219392ef;
    auVar46._12_4_ = 0x219392ef;
    uVar28 = vcmpps_avx512vl(auVar43,auVar46,1);
    bVar8 = (bool)((byte)uVar28 & 1);
    auVar59._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar3.x;
    bVar8 = (bool)((byte)(uVar28 >> 1) & 1);
    auVar59._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar3.y;
    bVar8 = (bool)((byte)(uVar28 >> 2) & 1);
    auVar59._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar3.z;
    bVar8 = (bool)((byte)(uVar28 >> 3) & 1);
    auVar59._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar3.field_3.a;
    auVar43 = vrcp14ps_avx512vl(auVar59);
    auVar44._8_4_ = 0x3f800000;
    auVar44._0_8_ = 0x3f8000003f800000;
    auVar44._12_4_ = 0x3f800000;
    auVar44 = vfnmadd213ps_avx512vl(auVar59,auVar43,auVar44);
    vfmadd132ps_fma(auVar44,auVar43,auVar43);
    auVar44 = vucomiss_avx512f(auVar40);
    auVar61 = vbroadcastss_avx512vl(auVar44);
    auVar89 = ZEXT3264(auVar61);
    auVar43 = vmovshdup_avx(auVar44);
    auVar61 = vbroadcastsd_avx512vl(auVar43);
    auVar90 = ZEXT3264(auVar61);
    auVar64._8_4_ = 2;
    auVar64._0_8_ = 0x200000002;
    auVar64._12_4_ = 2;
    auVar64._16_4_ = 2;
    auVar64._20_4_ = 2;
    auVar64._24_4_ = 2;
    auVar64._28_4_ = 2;
    vshufpd_avx(auVar44,auVar44,1);
    auVar61 = vpermps_avx512vl(auVar64,ZEXT1632(auVar44));
    auVar91 = ZEXT3264(auVar61);
    fVar69 = auVar44._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar61 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar92 = ZEXT3264(auVar61);
    auVar63 = ZEXT1632(CONCAT412(auVar44._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar44._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar44._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar69))
                                ));
    auVar62 = vpermps_avx512vl(auVar61,auVar63);
    auVar61 = vpermps_avx2(auVar64,auVar63);
    lVar26 = 0;
    vucomiss_avx512f(auVar40);
    vucomiss_avx512f(auVar40);
    uVar75 = auVar41._0_4_;
    local_2398._4_4_ = uVar75;
    local_2398._0_4_ = uVar75;
    local_2398._8_4_ = uVar75;
    local_2398._12_4_ = uVar75;
    local_2398._16_4_ = uVar75;
    local_2398._20_4_ = uVar75;
    local_2398._24_4_ = uVar75;
    local_2398._28_4_ = uVar75;
    auVar79 = ZEXT3264(local_2398);
    uVar75 = auVar42._0_4_;
    auVar73 = ZEXT3264(CONCAT428(uVar75,CONCAT424(uVar75,CONCAT420(uVar75,CONCAT416(uVar75,CONCAT412
                                                  (uVar75,CONCAT48(uVar75,CONCAT44(uVar75,uVar75))))
                                                  ))));
    local_23b8._0_8_ = CONCAT44(fVar69,fVar69) ^ 0x8000000080000000;
    local_23b8._8_4_ = -fVar69;
    local_23b8._12_4_ = -fVar69;
    local_23b8._16_4_ = -fVar69;
    local_23b8._20_4_ = -fVar69;
    local_23b8._24_4_ = -fVar69;
    local_23b8._28_4_ = -fVar69;
    auVar81 = ZEXT3264(local_23b8);
    local_23d8._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
    local_23d8._8_4_ = auVar62._8_4_ ^ 0x80000000;
    local_23d8._12_4_ = auVar62._12_4_ ^ 0x80000000;
    local_23d8._16_4_ = auVar62._16_4_ ^ 0x80000000;
    local_23d8._20_4_ = auVar62._20_4_ ^ 0x80000000;
    local_23d8._24_4_ = auVar62._24_4_ ^ 0x80000000;
    local_23d8._28_4_ = auVar62._28_4_ ^ 0x80000000;
    auVar83 = ZEXT3264(local_23d8);
    local_23f8._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
    local_23f8._8_4_ = auVar61._8_4_ ^ 0x80000000;
    local_23f8._12_4_ = auVar61._12_4_ ^ 0x80000000;
    local_23f8._16_4_ = auVar61._16_4_ ^ 0x80000000;
    local_23f8._20_4_ = auVar61._20_4_ ^ 0x80000000;
    local_23f8._24_4_ = auVar61._24_4_ ^ 0x80000000;
    local_23f8._28_4_ = auVar61._28_4_ ^ 0x80000000;
    auVar85 = ZEXT3264(local_23f8);
    auVar86 = ZEXT3264(_DAT_01fe9900);
    auVar87 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    local_25b0 = 0;
    do {
      pfVar1 = (float *)(local_25a8 + -1);
      local_25a8 = local_25a8 + -2;
      if (*pfVar1 <= auVar74._0_4_) {
        uVar28 = *local_25a8;
        while ((uVar28 & 8) == 0) {
          pauVar20 = (undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0);
          uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar65._4_4_ = uVar75;
          auVar65._0_4_ = uVar75;
          auVar65._8_4_ = uVar75;
          auVar65._12_4_ = uVar75;
          auVar65._16_4_ = uVar75;
          auVar65._20_4_ = uVar75;
          auVar65._24_4_ = uVar75;
          auVar65._28_4_ = uVar75;
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar20[8] + lVar26),auVar65,
                                    *(undefined1 (*) [32])(pauVar20[2] + lVar26));
          auVar80 = auVar81._0_32_;
          auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar89._0_32_,auVar80);
          auVar61 = vmaxps_avx(auVar79._0_32_,auVar61);
          auVar43 = vfmadd213ps_fma(pauVar20[10],auVar65,pauVar20[4]);
          auVar44 = vfmadd213ps_fma(pauVar20[0xc],auVar65,pauVar20[6]);
          auVar82 = auVar83._0_32_;
          auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar90._0_32_,auVar82);
          auVar84 = auVar85._0_32_;
          auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar91._0_32_,auVar84);
          auVar62 = vmaxps_avx(auVar62,auVar63);
          auVar61 = vmaxps_avx(auVar61,auVar62);
          auVar43 = vfmadd213ps_fma(pauVar20[9],auVar65,pauVar20[3]);
          auVar44 = vfmadd213ps_fma(pauVar20[0xb],auVar65,pauVar20[5]);
          auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar89._0_32_,auVar80);
          auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar44),auVar90._0_32_,auVar82);
          auVar43 = vfmadd213ps_fma(pauVar20[0xd],auVar65,pauVar20[7]);
          auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar43),auVar91._0_32_,auVar84);
          auVar62 = vminps_avx(auVar62,auVar64);
          auVar63 = vminps_avx(auVar73._0_32_,auVar63);
          auVar62 = vminps_avx(auVar63,auVar62);
          uVar39 = vcmpps_avx512vl(auVar61,auVar62,2);
          if (((uint)uVar28 & 7) == 6) {
            uVar28 = vcmpps_avx512vl(auVar65,pauVar20[0xe],0xd);
            uVar29 = vcmpps_avx512vl(auVar65,pauVar20[0xf],1);
            uVar39 = uVar39 & uVar28 & uVar29;
          }
          bVar18 = (byte)uVar39;
          if (bVar18 == 0) {
            auVar43 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar74 = ZEXT1664(auVar43);
            goto LAB_01f1f94c;
          }
          auVar62 = *pauVar20;
          auVar63 = pauVar20[1];
          auVar64 = vpternlogd_avx512vl(auVar86._0_32_,auVar61,auVar87._0_32_,0xf8);
          auVar65 = vpcompressd_avx512vl(auVar64);
          auVar67._0_4_ =
               (uint)(bVar18 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar64._0_4_;
          bVar8 = (bool)((byte)(uVar39 >> 1) & 1);
          auVar67._4_4_ = (uint)bVar8 * auVar65._4_4_ | (uint)!bVar8 * auVar64._4_4_;
          bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
          auVar67._8_4_ = (uint)bVar8 * auVar65._8_4_ | (uint)!bVar8 * auVar64._8_4_;
          bVar8 = (bool)((byte)(uVar39 >> 3) & 1);
          auVar67._12_4_ = (uint)bVar8 * auVar65._12_4_ | (uint)!bVar8 * auVar64._12_4_;
          bVar8 = (bool)((byte)(uVar39 >> 4) & 1);
          auVar67._16_4_ = (uint)bVar8 * auVar65._16_4_ | (uint)!bVar8 * auVar64._16_4_;
          bVar8 = (bool)((byte)(uVar39 >> 5) & 1);
          auVar67._20_4_ = (uint)bVar8 * auVar65._20_4_ | (uint)!bVar8 * auVar64._20_4_;
          bVar8 = (bool)((byte)(uVar39 >> 6) & 1);
          auVar67._24_4_ = (uint)bVar8 * auVar65._24_4_ | (uint)!bVar8 * auVar64._24_4_;
          bVar8 = SUB81(uVar39 >> 7,0);
          auVar67._28_4_ = (uint)bVar8 * auVar65._28_4_ | (uint)!bVar8 * auVar64._28_4_;
          auVar64 = vpermt2q_avx512vl(auVar62,auVar67,auVar63);
          uVar28 = auVar64._0_8_;
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 != 0) {
            auVar64 = vpshufd_avx2(auVar67,0x55);
            vpermt2q_avx512vl(auVar62,auVar64,auVar63);
            auVar65 = vpminsd_avx2(auVar67,auVar64);
            auVar64 = vpmaxsd_avx2(auVar67,auVar64);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 == 0) {
              auVar65 = vpermi2q_avx512vl(auVar65,auVar62,auVar63);
              uVar28 = auVar65._0_8_;
              auVar62 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
              *local_25a8 = auVar62._0_8_;
              auVar61 = vpermd_avx2(auVar64,auVar61);
              *(int *)(local_25a8 + 1) = auVar61._0_4_;
              local_25a8 = local_25a8 + 2;
            }
            else {
              auVar12 = vpshufd_avx2(auVar67,0xaa);
              vpermt2q_avx512vl(auVar62,auVar12,auVar63);
              auVar68 = vpminsd_avx2(auVar65,auVar12);
              auVar65 = vpmaxsd_avx2(auVar65,auVar12);
              auVar12 = vpminsd_avx2(auVar64,auVar65);
              auVar64 = vpmaxsd_avx2(auVar64,auVar65);
              bVar18 = bVar18 - 1 & bVar18;
              if (bVar18 == 0) {
                auVar65 = vpermi2q_avx512vl(auVar68,auVar62,auVar63);
                uVar28 = auVar65._0_8_;
                auVar65 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                *local_25a8 = auVar65._0_8_;
                auVar64 = vpermd_avx2(auVar64,auVar61);
                *(int *)(local_25a8 + 1) = auVar64._0_4_;
                auVar62 = vpermt2q_avx512vl(auVar62,auVar12,auVar63);
                local_25a8[2] = auVar62._0_8_;
                auVar61 = vpermd_avx2(auVar12,auVar61);
                *(int *)(local_25a8 + 3) = auVar61._0_4_;
                local_25a8 = local_25a8 + 4;
              }
              else {
                auVar65 = vpshufd_avx2(auVar67,0xff);
                vpermt2q_avx512vl(auVar62,auVar65,auVar63);
                auVar11 = vpminsd_avx2(auVar68,auVar65);
                auVar65 = vpmaxsd_avx2(auVar68,auVar65);
                auVar68 = vpminsd_avx2(auVar12,auVar65);
                auVar65 = vpmaxsd_avx2(auVar12,auVar65);
                auVar12 = vpminsd_avx2(auVar64,auVar65);
                auVar64 = vpmaxsd_avx2(auVar64,auVar65);
                bVar18 = bVar18 - 1 & bVar18;
                if (bVar18 == 0) {
                  auVar65 = vpermi2q_avx512vl(auVar11,auVar62,auVar63);
                  uVar28 = auVar65._0_8_;
                  auVar65 = vpermt2q_avx512vl(auVar62,auVar64,auVar63);
                  *local_25a8 = auVar65._0_8_;
                  auVar64 = vpermd_avx2(auVar64,auVar61);
                  *(int *)(local_25a8 + 1) = auVar64._0_4_;
                  auVar64 = vpermt2q_avx512vl(auVar62,auVar12,auVar63);
                  local_25a8[2] = auVar64._0_8_;
                  auVar64 = vpermd_avx2(auVar12,auVar61);
                  *(int *)(local_25a8 + 3) = auVar64._0_4_;
                  auVar62 = vpermt2q_avx512vl(auVar62,auVar68,auVar63);
                  local_25a8[4] = auVar62._0_8_;
                  auVar61 = vpermd_avx2(auVar68,auVar61);
                  *(int *)(local_25a8 + 5) = auVar61._0_4_;
                  local_25a8 = local_25a8 + 6;
                }
                else {
                  auVar66 = valignd_avx512vl(auVar67,auVar67,3);
                  auVar65 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar67 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar65,auVar11);
                  auVar65 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar67 = vpermt2d_avx512vl(auVar67,auVar65,auVar68);
                  auVar67 = vpermt2d_avx512vl(auVar67,auVar65,auVar12);
                  auVar65 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar64 = vpermt2d_avx512vl(auVar67,auVar65,auVar64);
                  auVar74 = ZEXT3264(auVar64);
                  bVar23 = bVar18;
                  do {
                    auVar65 = auVar74._0_32_;
                    auVar64 = vpermps_avx512vl(auVar92._0_32_,auVar66);
                    auVar66 = valignd_avx512vl(auVar66,auVar66,1);
                    vpermt2q_avx512vl(auVar62,auVar66,auVar63);
                    bVar23 = bVar23 - 1 & bVar23;
                    uVar16 = vpcmpd_avx512vl(auVar64,auVar65,5);
                    auVar64 = vpmaxsd_avx2(auVar64,auVar65);
                    bVar22 = (byte)uVar16 << 1;
                    auVar65 = valignd_avx512vl(auVar65,auVar65,7);
                    bVar8 = (bool)((byte)uVar16 & 1);
                    auVar68._4_4_ = (uint)bVar8 * auVar65._4_4_ | (uint)!bVar8 * auVar64._4_4_;
                    auVar68._0_4_ = auVar64._0_4_;
                    bVar8 = (bool)(bVar22 >> 2 & 1);
                    auVar68._8_4_ = (uint)bVar8 * auVar65._8_4_ | (uint)!bVar8 * auVar64._8_4_;
                    bVar8 = (bool)(bVar22 >> 3 & 1);
                    auVar68._12_4_ = (uint)bVar8 * auVar65._12_4_ | (uint)!bVar8 * auVar64._12_4_;
                    bVar8 = (bool)(bVar22 >> 4 & 1);
                    auVar68._16_4_ = (uint)bVar8 * auVar65._16_4_ | (uint)!bVar8 * auVar64._16_4_;
                    bVar8 = (bool)(bVar22 >> 5 & 1);
                    auVar68._20_4_ = (uint)bVar8 * auVar65._20_4_ | (uint)!bVar8 * auVar64._20_4_;
                    bVar8 = (bool)(bVar22 >> 6 & 1);
                    auVar68._24_4_ = (uint)bVar8 * auVar65._24_4_ | (uint)!bVar8 * auVar64._24_4_;
                    auVar68._28_4_ =
                         (uint)(bVar22 >> 7) * auVar65._28_4_ |
                         (uint)!(bool)(bVar22 >> 7) * auVar64._28_4_;
                    auVar74 = ZEXT3264(auVar68);
                  } while (bVar23 != 0);
                  lVar21 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
                  do {
                    auVar64 = vpermi2q_avx512vl(auVar68,auVar62,auVar63);
                    *local_25a8 = auVar64._0_8_;
                    auVar65 = auVar74._0_32_;
                    auVar64 = vpermd_avx2(auVar65,auVar61);
                    *(int *)(local_25a8 + 1) = auVar64._0_4_;
                    auVar68 = valignd_avx512vl(auVar65,auVar65,1);
                    local_25a8 = local_25a8 + 2;
                    auVar74 = ZEXT3264(auVar68);
                    lVar21 = lVar21 + -1;
                  } while (lVar21 != 0);
                  auVar61 = vpermt2q_avx512vl(auVar62,auVar68,auVar63);
                  uVar28 = auVar61._0_8_;
                }
                auVar43 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
                auVar88 = ZEXT1664(auVar43);
                auVar79 = ZEXT3264(auVar79._0_32_);
                auVar81 = ZEXT3264(auVar80);
                auVar83 = ZEXT3264(auVar82);
                auVar85 = ZEXT3264(auVar84);
                auVar86 = ZEXT3264(auVar86._0_32_);
                auVar87 = ZEXT3264(auVar87._0_32_);
              }
            }
          }
        }
        local_25a0 = (ulong)((uint)uVar28 & 0xf) - 8;
        if (local_25a0 != 0) {
          uVar28 = uVar28 & 0xfffffffffffffff0;
          local_25d0 = local_25d8->scene;
          lVar26 = 0;
          do {
            lVar25 = lVar26 * 0x50;
            pGVar6 = (local_25d0->geometries).items[*(uint *)(uVar28 + 0x30 + lVar25)].ptr;
            fVar69 = (pGVar6->time_range).lower;
            fVar69 = pGVar6->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar69) /
                     ((pGVar6->time_range).upper - fVar69));
            auVar43 = vroundss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69),9);
            auVar43 = vminss_avx(auVar43,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar45 = vmaxss_avx512f(auVar88._0_16_,auVar43);
            lVar27 = (long)(int)auVar45._0_4_ * 0x38;
            lVar21 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar27);
            auVar43 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar28 + lVar25) * 4);
            uVar29 = (ulong)*(uint *)(uVar28 + 0x10 + lVar25);
            auVar44 = *(undefined1 (*) [16])(lVar21 + uVar29 * 4);
            uVar30 = CONCAT44(0,*(uint *)(uVar28 + 0x20 + lVar25));
            local_24d8._0_8_ = uVar30;
            auVar40 = *(undefined1 (*) [16])(lVar21 + uVar30 * 4);
            uVar31 = CONCAT44(0,*(uint *)(uVar28 + 4 + lVar25));
            local_24f8._0_8_ = uVar31;
            auVar41 = *(undefined1 (*) [16])(lVar21 + uVar31 * 4);
            uVar32 = CONCAT44(0,*(uint *)(uVar28 + 0x14 + lVar25));
            local_2518._0_8_ = uVar32;
            auVar42 = *(undefined1 (*) [16])(lVar21 + uVar32 * 4);
            uVar33 = CONCAT44(0,*(uint *)(uVar28 + 0x24 + lVar25));
            local_25c8._0_8_ = uVar33;
            auVar59 = *(undefined1 (*) [16])(lVar21 + uVar33 * 4);
            uVar37 = (ulong)*(uint *)(uVar28 + 8 + lVar25);
            auVar46 = *(undefined1 (*) [16])(lVar21 + uVar37 * 4);
            uVar38 = (ulong)*(uint *)(uVar28 + 0x18 + lVar25);
            auVar48 = *(undefined1 (*) [16])(lVar21 + uVar38 * 4);
            uVar36 = (ulong)*(uint *)(uVar28 + 0x28 + lVar25);
            auVar57 = *(undefined1 (*) [16])(lVar21 + uVar36 * 4);
            uVar35 = (ulong)*(uint *)(uVar28 + 0xc + lVar25);
            auVar58 = *(undefined1 (*) [16])(lVar21 + uVar35 * 4);
            uVar34 = (ulong)*(uint *)(uVar28 + 0x1c + lVar25);
            auVar56 = *(undefined1 (*) [16])(lVar21 + uVar34 * 4);
            lVar27 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar27);
            uVar39 = (ulong)*(uint *)(uVar28 + 0x2c + lVar25);
            auVar47 = *(undefined1 (*) [16])(lVar21 + uVar39 * 4);
            auVar49 = *(undefined1 (*) [16])(lVar27 + (ulong)*(uint *)(uVar28 + lVar25) * 4);
            auVar50 = *(undefined1 (*) [16])(lVar27 + uVar29 * 4);
            auVar53 = *(undefined1 (*) [16])(lVar27 + uVar30 * 4);
            auVar51 = *(undefined1 (*) [16])(lVar27 + uVar31 * 4);
            auVar52 = *(undefined1 (*) [16])(lVar27 + uVar32 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar27 + uVar33 * 4);
            auVar55 = *(undefined1 (*) [16])(lVar27 + uVar37 * 4);
            auVar70 = *(undefined1 (*) [16])(lVar27 + uVar38 * 4);
            auVar4 = *(undefined1 (*) [16])(lVar27 + uVar36 * 4);
            auVar5 = *(undefined1 (*) [16])(lVar27 + uVar35 * 4);
            auVar60 = *(undefined1 (*) [16])(lVar27 + uVar34 * 4);
            auVar71 = *(undefined1 (*) [16])(lVar27 + uVar39 * 4);
            puVar2 = (undefined8 *)(uVar28 + 0x30 + lVar25);
            local_2408 = *puVar2;
            uStack_2400 = puVar2[1];
            puVar2 = (undefined8 *)(uVar28 + 0x40 + lVar25);
            auVar9 = vunpcklps_avx(auVar43,auVar46);
            auVar43 = vunpckhps_avx(auVar43,auVar46);
            auVar46 = vunpcklps_avx(auVar41,auVar58);
            auVar41 = vunpckhps_avx(auVar41,auVar58);
            auVar58 = vunpcklps_avx(auVar43,auVar41);
            auVar10 = vunpcklps_avx(auVar9,auVar46);
            auVar43 = vunpckhps_avx(auVar9,auVar46);
            auVar46 = vunpcklps_avx(auVar44,auVar48);
            auVar44 = vunpckhps_avx(auVar44,auVar48);
            auVar48 = vunpcklps_avx(auVar42,auVar56);
            auVar41 = vunpckhps_avx(auVar42,auVar56);
            auVar42 = vunpcklps_avx(auVar44,auVar41);
            auVar56 = vunpcklps_avx(auVar46,auVar48);
            auVar44 = vunpckhps_avx(auVar46,auVar48);
            auVar46 = vunpcklps_avx(auVar40,auVar57);
            auVar40 = vunpckhps_avx(auVar40,auVar57);
            auVar48 = vunpcklps_avx(auVar59,auVar47);
            auVar41 = vunpckhps_avx(auVar59,auVar47);
            auVar59 = vunpcklps_avx(auVar40,auVar41);
            auVar57 = vunpcklps_avx(auVar46,auVar48);
            auVar40 = vunpckhps_avx(auVar46,auVar48);
            auVar41 = vunpcklps_avx512vl(auVar49,auVar55);
            auVar46 = vunpckhps_avx512vl(auVar49,auVar55);
            auVar47 = vunpcklps_avx512vl(auVar51,auVar5);
            auVar48 = vunpckhps_avx512vl(auVar51,auVar5);
            auVar46 = vunpcklps_avx(auVar46,auVar48);
            auVar48 = vunpcklps_avx(auVar41,auVar47);
            auVar41 = vunpckhps_avx(auVar41,auVar47);
            auVar47 = vunpcklps_avx512vl(auVar50,auVar70);
            auVar49 = vunpckhps_avx512vl(auVar50,auVar70);
            auVar50 = vunpcklps_avx512vl(auVar52,auVar60);
            auVar51 = vunpckhps_avx512vl(auVar52,auVar60);
            auVar49 = vunpcklps_avx512vl(auVar49,auVar51);
            auVar51 = vunpcklps_avx512vl(auVar47,auVar50);
            auVar50 = vunpckhps_avx512vl(auVar47,auVar50);
            auVar52 = vunpcklps_avx512vl(auVar53,auVar4);
            auVar47 = vunpckhps_avx512vl(auVar53,auVar4);
            auVar53 = vunpcklps_avx512vl(auVar54,auVar71);
            auVar54 = vunpckhps_avx512vl(auVar54,auVar71);
            auVar47 = vunpcklps_avx(auVar47,auVar54);
            auVar54 = vunpcklps_avx512vl(auVar52,auVar53);
            auVar53 = vunpckhps_avx512vl(auVar52,auVar53);
            auVar55 = ZEXT416((uint)(fVar69 - auVar45._0_4_));
            auVar52 = vbroadcastss_avx512vl(auVar55);
            auVar55 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
            auVar70._0_4_ = auVar55._0_4_;
            auVar70._4_4_ = auVar70._0_4_;
            auVar70._8_4_ = auVar70._0_4_;
            auVar70._12_4_ = auVar70._0_4_;
            auVar48 = vmulps_avx512vl(auVar52,auVar48);
            auVar41 = vmulps_avx512vl(auVar52,auVar41);
            auVar55 = vmulps_avx512vl(auVar52,auVar46);
            auVar46 = vfmadd231ps_fma(auVar48,auVar70,auVar10);
            auVar48 = vfmadd231ps_fma(auVar41,auVar70,auVar43);
            auVar58 = vfmadd231ps_fma(auVar55,auVar70,auVar58);
            auVar43 = vmulps_avx512vl(auVar52,auVar51);
            auVar41 = vmulps_avx512vl(auVar52,auVar50);
            auVar49 = vmulps_avx512vl(auVar52,auVar49);
            auVar43 = vfmadd231ps_fma(auVar43,auVar70,auVar56);
            auVar44 = vfmadd231ps_fma(auVar41,auVar70,auVar44);
            auVar41 = vfmadd231ps_fma(auVar49,auVar70,auVar42);
            auVar42 = vmulps_avx512vl(auVar52,auVar54);
            auVar56 = vmulps_avx512vl(auVar52,auVar53);
            auVar47 = vmulps_avx512vl(auVar52,auVar47);
            auVar42 = vfmadd231ps_fma(auVar42,auVar70,auVar57);
            auVar57 = vfmadd231ps_fma(auVar56,auVar70,auVar40);
            auVar59 = vfmadd231ps_fma(auVar47,auVar70,auVar59);
            local_2528 = *puVar2;
            uStack_2520 = puVar2[1];
            auVar43 = vsubps_avx(auVar46,auVar43);
            auVar44 = vsubps_avx(auVar48,auVar44);
            auVar40 = vsubps_avx(auVar58,auVar41);
            auVar41 = vsubps_avx(auVar42,auVar46);
            auVar42 = vsubps_avx(auVar57,auVar48);
            auVar59 = vsubps_avx(auVar59,auVar58);
            auVar47._0_4_ = auVar59._0_4_ * auVar44._0_4_;
            auVar47._4_4_ = auVar59._4_4_ * auVar44._4_4_;
            auVar47._8_4_ = auVar59._8_4_ * auVar44._8_4_;
            auVar47._12_4_ = auVar59._12_4_ * auVar44._12_4_;
            local_2438 = vfmsub231ps_fma(auVar47,auVar42,auVar40);
            auVar49._0_4_ = auVar40._0_4_ * auVar41._0_4_;
            auVar49._4_4_ = auVar40._4_4_ * auVar41._4_4_;
            auVar49._8_4_ = auVar40._8_4_ * auVar41._8_4_;
            auVar49._12_4_ = auVar40._12_4_ * auVar41._12_4_;
            local_2428 = vfmsub231ps_fma(auVar49,auVar59,auVar43);
            auVar50._0_4_ = auVar43._0_4_ * auVar42._0_4_;
            auVar50._4_4_ = auVar43._4_4_ * auVar42._4_4_;
            auVar50._8_4_ = auVar43._8_4_ * auVar42._8_4_;
            auVar50._12_4_ = auVar43._12_4_ * auVar42._12_4_;
            fVar69 = (ray->super_RayK<1>).dir.field_0.m128[0];
            auVar51._4_4_ = fVar69;
            auVar51._0_4_ = fVar69;
            auVar51._8_4_ = fVar69;
            auVar51._12_4_ = fVar69;
            auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar75 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar57._4_4_ = uVar75;
            auVar57._0_4_ = uVar75;
            auVar57._8_4_ = uVar75;
            auVar57._12_4_ = uVar75;
            auVar57 = vsubps_avx512vl(auVar46,auVar57);
            local_2418 = vfmsub231ps_fma(auVar50,auVar41,auVar44);
            uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar56._4_4_ = uVar75;
            auVar56._0_4_ = uVar75;
            auVar56._8_4_ = uVar75;
            auVar56._12_4_ = uVar75;
            auVar56 = vsubps_avx512vl(auVar48,auVar56);
            uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar48._4_4_ = uVar75;
            auVar48._0_4_ = uVar75;
            auVar48._8_4_ = uVar75;
            auVar48._12_4_ = uVar75;
            auVar48 = vsubps_avx512vl(auVar58,auVar48);
            auVar46 = vmulps_avx512vl(auVar47,auVar48);
            auVar50 = vfmsub231ps_avx512vl(auVar46,auVar56,auVar49);
            auVar46 = vmulps_avx512vl(auVar49,auVar57);
            auVar46 = vfmsub231ps_fma(auVar46,auVar48,auVar51);
            auVar53._0_4_ = fVar69 * auVar56._0_4_;
            auVar53._4_4_ = fVar69 * auVar56._4_4_;
            auVar53._8_4_ = fVar69 * auVar56._8_4_;
            auVar53._12_4_ = fVar69 * auVar56._12_4_;
            auVar53 = vfmsub231ps_avx512vl(auVar53,auVar57,auVar47);
            auVar58 = vmulps_avx512vl(local_2418,auVar49);
            auVar58 = vfmadd231ps_avx512vl(auVar58,local_2428,auVar47);
            auVar47 = vfmadd231ps_avx512vl(auVar58,local_2438,auVar51);
            auVar58._8_4_ = 0x7fffffff;
            auVar58._0_8_ = 0x7fffffff7fffffff;
            auVar58._12_4_ = 0x7fffffff;
            local_2488 = vandps_avx512vl(auVar47,auVar58);
            auVar59 = vmulps_avx512vl(auVar59,auVar53);
            auVar42 = vfmadd231ps_avx512vl(auVar59,auVar46,auVar42);
            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar50,auVar41);
            auVar41._8_4_ = 0x80000000;
            auVar41._0_8_ = 0x8000000080000000;
            auVar41._12_4_ = 0x80000000;
            auVar41 = vandpd_avx512vl(auVar47,auVar41);
            local_24b8 = vxorps_avx512vl(auVar41,auVar42);
            auVar42._0_4_ = auVar40._0_4_ * auVar53._0_4_;
            auVar42._4_4_ = auVar40._4_4_ * auVar53._4_4_;
            auVar42._8_4_ = auVar40._8_4_ * auVar53._8_4_;
            auVar42._12_4_ = auVar40._12_4_ * auVar53._12_4_;
            auVar44 = vfmadd231ps_fma(auVar42,auVar44,auVar46);
            auVar43 = vfmadd231ps_fma(auVar44,auVar43,auVar50);
            local_24a8._0_4_ = (float)(auVar41._0_4_ ^ auVar43._0_4_);
            local_24a8._4_4_ = (float)(auVar41._4_4_ ^ auVar43._4_4_);
            local_24a8._8_4_ = (float)(auVar41._8_4_ ^ auVar43._8_4_);
            local_24a8._12_4_ = (float)(auVar41._12_4_ ^ auVar43._12_4_);
            auVar43 = ZEXT816(0) << 0x20;
            uVar16 = vcmpps_avx512vl(local_24b8,auVar43,5);
            uVar13 = vcmpps_avx512vl(local_24a8,auVar43,5);
            uVar14 = vcmpps_avx512vl(auVar47,auVar43,4);
            auVar40._0_4_ = local_24b8._0_4_ + local_24a8._0_4_;
            auVar40._4_4_ = local_24b8._4_4_ + local_24a8._4_4_;
            auVar40._8_4_ = local_24b8._8_4_ + local_24a8._8_4_;
            auVar40._12_4_ = local_24b8._12_4_ + local_24a8._12_4_;
            uVar15 = vcmpps_avx512vl(auVar40,local_2488,2);
            bVar18 = (byte)uVar16 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
            if (bVar18 != 0) {
              auVar55._0_4_ = auVar48._0_4_ * local_2418._0_4_;
              auVar55._4_4_ = auVar48._4_4_ * local_2418._4_4_;
              auVar55._8_4_ = auVar48._8_4_ * local_2418._8_4_;
              auVar55._12_4_ = auVar48._12_4_ * local_2418._12_4_;
              auVar43 = vfmadd213ps_fma(auVar56,local_2428,auVar55);
              auVar43 = vfmadd213ps_fma(auVar57,local_2438,auVar43);
              local_2498._0_4_ = (float)(auVar41._0_4_ ^ auVar43._0_4_);
              local_2498._4_4_ = (float)(auVar41._4_4_ ^ auVar43._4_4_);
              local_2498._8_4_ = (float)(auVar41._8_4_ ^ auVar43._8_4_);
              local_2498._12_4_ = (float)(auVar41._12_4_ ^ auVar43._12_4_);
              uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar52._4_4_ = uVar75;
              auVar52._0_4_ = uVar75;
              auVar52._8_4_ = uVar75;
              auVar52._12_4_ = uVar75;
              auVar43 = vmulps_avx512vl(local_2488,auVar52);
              fVar69 = (ray->super_RayK<1>).tfar;
              auVar54._4_4_ = fVar69;
              auVar54._0_4_ = fVar69;
              auVar54._8_4_ = fVar69;
              auVar54._12_4_ = fVar69;
              auVar44 = vmulps_avx512vl(local_2488,auVar54);
              uVar16 = vcmpps_avx512vl(local_2498,auVar44,2);
              uVar13 = vcmpps_avx512vl(auVar43,local_2498,1);
              bVar18 = (byte)uVar16 & (byte)uVar13 & bVar18;
              if (bVar18 != 0) {
                auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                auVar4._4_4_ = (ray->super_RayK<1>).mask;
                auVar4._8_4_ = (ray->super_RayK<1>).id;
                auVar4._12_4_ = (ray->super_RayK<1>).flags;
                auVar74 = ZEXT1664(auVar4);
                uVar19 = vextractps_avx(auVar4,1);
                local_2477 = bVar18;
                auVar43 = vrcp14ps_avx512vl(local_2488);
                auVar5._8_4_ = 0x3f800000;
                auVar5._0_8_ = 0x3f8000003f800000;
                auVar5._12_4_ = 0x3f800000;
                auVar44 = vfnmadd213ps_avx512vl(local_2488,auVar43,auVar5);
                auVar43 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
                fVar69 = auVar43._0_4_;
                local_2448._0_4_ = fVar69 * local_2498._0_4_;
                fVar76 = auVar43._4_4_;
                local_2448._4_4_ = fVar76 * local_2498._4_4_;
                fVar77 = auVar43._8_4_;
                local_2448._8_4_ = fVar77 * local_2498._8_4_;
                fVar78 = auVar43._12_4_;
                local_2448._12_4_ = fVar78 * local_2498._12_4_;
                auVar73 = ZEXT1664(local_2448);
                local_2468[0] = fVar69 * local_24b8._0_4_;
                local_2468[1] = fVar76 * local_24b8._4_4_;
                local_2468[2] = fVar77 * local_24b8._8_4_;
                local_2468[3] = fVar78 * local_24b8._12_4_;
                local_2458[0] = fVar69 * local_24a8._0_4_;
                local_2458[1] = fVar76 * local_24a8._4_4_;
                local_2458[2] = fVar77 * local_24a8._8_4_;
                local_2458[3] = fVar78 * local_24a8._12_4_;
                auVar71._8_4_ = 0x7f800000;
                auVar71._0_8_ = 0x7f8000007f800000;
                auVar71._12_4_ = 0x7f800000;
                auVar43 = vblendmps_avx512vl(auVar71,local_2448);
                auVar60._0_4_ =
                     (uint)(bVar18 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
                bVar8 = (bool)(bVar18 >> 1 & 1);
                auVar60._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(bVar18 >> 2 & 1);
                auVar60._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(bVar18 >> 3 & 1);
                auVar60._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * 0x7f800000;
                auVar43 = vshufps_avx(auVar60,auVar60,0xb1);
                auVar43 = vminps_avx(auVar43,auVar60);
                auVar44 = vshufpd_avx(auVar43,auVar43,1);
                auVar43 = vminps_avx(auVar44,auVar43);
                uVar16 = vcmpps_avx512vl(auVar60,auVar43,0);
                bVar23 = (byte)uVar16 & bVar18;
                do {
                  auVar44 = auVar88._0_16_;
                  local_2538 = auVar74._0_16_;
                  auVar43 = auVar73._0_16_;
                  bVar22 = bVar18;
                  if (bVar23 != 0) {
                    bVar22 = bVar23;
                  }
                  uVar17 = 0;
                  for (uVar24 = (uint)bVar22; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000)
                  {
                    uVar17 = uVar17 + 1;
                  }
                  local_2550 = *(uint *)((long)&local_2408 + (ulong)uVar17 * 4);
                  local_25b8 = (local_25d0->geometries).items[local_2550].ptr;
                  if ((local_25b8->mask & uVar19) == 0) {
                    bVar18 = ~(byte)(1 << (uVar17 & 0x1f)) & bVar18;
                  }
                  else {
                    pRVar7 = local_25d8->args;
                    auVar63 = auVar91._0_32_;
                    auVar62 = auVar90._0_32_;
                    auVar61 = auVar89._0_32_;
                    if (pRVar7->filter == (RTCFilterFunctionN)0x0) {
                      local_2598.context = local_25d8->user;
                      if (local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar39 = (ulong)(uVar17 << 2);
                        fVar69 = *(float *)((long)local_2468 + uVar39);
                        fVar76 = *(float *)((long)local_2458 + uVar39);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2448 + uVar39);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2438 + uVar39);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2428 + uVar39);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_2418 + uVar39);
                        ray->u = fVar69;
                        ray->v = fVar76;
                        ray->primID = *(uint *)((long)&local_2528 + uVar39);
                        ray->geomID = local_2550;
                        ray->instID[0] = (local_2598.context)->instID[0];
                        ray->instPrimID[0] = (local_2598.context)->instPrimID[0];
                        break;
                      }
                      local_25c8 = auVar43;
                      local_2518 = auVar63;
                      local_24f8 = auVar62;
                      local_24d8 = auVar61;
                    }
                    else {
                      local_25c8 = auVar43;
                      local_2518 = auVar63;
                      local_24f8 = auVar62;
                      local_24d8 = auVar61;
                      local_2598.context = local_25d8->user;
                    }
                    uVar39 = (ulong)(uVar17 * 4);
                    local_2568 = *(float *)(local_2438 + uVar39);
                    local_2564 = *(undefined4 *)(local_2428 + uVar39);
                    local_2560 = *(undefined4 *)(local_2418 + uVar39);
                    local_255c = *(undefined4 *)((long)local_2468 + uVar39);
                    local_2558 = *(undefined4 *)((long)local_2458 + uVar39);
                    local_2554 = *(undefined4 *)((long)&local_2528 + uVar39);
                    local_254c = (local_2598.context)->instID[0];
                    local_2548 = (local_2598.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2448 + uVar39);
                    local_25dc = -1;
                    local_2598.valid = &local_25dc;
                    local_2598.geometryUserPtr = local_25b8->userPtr;
                    local_2598.ray = (RTCRayN *)ray;
                    local_2598.hit = (RTCHitN *)&local_2568;
                    local_2598.N = 1;
                    local_25c8 = auVar43;
                    local_2518 = auVar63;
                    local_24f8 = auVar62;
                    local_24d8 = auVar61;
                    if (((local_25b8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_25b8->intersectionFilterN)(&local_2598), *local_2598.valid != 0))
                       && ((pRVar7->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_25b8->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar7->filter)(&local_2598), *local_2598.valid != 0)))))) {
                      (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2598.hit;
                      (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2598.hit + 4);
                      (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2598.hit + 8);
                      *(float *)((long)local_2598.ray + 0x3c) = *(float *)(local_2598.hit + 0xc);
                      *(float *)((long)local_2598.ray + 0x40) = *(float *)(local_2598.hit + 0x10);
                      *(float *)((long)local_2598.ray + 0x44) = *(float *)(local_2598.hit + 0x14);
                      *(float *)((long)local_2598.ray + 0x48) = *(float *)(local_2598.hit + 0x18);
                      *(float *)((long)local_2598.ray + 0x4c) = *(float *)(local_2598.hit + 0x1c);
                      *(float *)((long)local_2598.ray + 0x50) = *(float *)(local_2598.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_2538._0_4_;
                    }
                    auVar9._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar9._4_4_ = (ray->super_RayK<1>).mask;
                    auVar9._8_4_ = (ray->super_RayK<1>).id;
                    auVar9._12_4_ = (ray->super_RayK<1>).flags;
                    auVar74 = ZEXT1664(auVar9);
                    auVar73 = ZEXT1664(local_25c8);
                    fVar69 = (ray->super_RayK<1>).tfar;
                    auVar10._4_4_ = fVar69;
                    auVar10._0_4_ = fVar69;
                    auVar10._8_4_ = fVar69;
                    auVar10._12_4_ = fVar69;
                    uVar16 = vcmpps_avx512vl(local_25c8,auVar10,2);
                    bVar18 = ~(byte)(1 << (uVar17 & 0x1f)) & bVar18 & (byte)uVar16;
                    uVar19 = vextractps_avx(auVar9,1);
                    auVar43 = vxorps_avx512vl(auVar44,auVar44);
                    auVar88 = ZEXT1664(auVar43);
                    auVar89 = ZEXT3264(local_24d8);
                    auVar90 = ZEXT3264(local_24f8);
                    auVar91 = ZEXT3264(local_2518);
                    auVar61 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar92 = ZEXT3264(auVar61);
                  }
                  if (bVar18 == 0) break;
                  auVar72._8_4_ = 0x7f800000;
                  auVar72._0_8_ = 0x7f8000007f800000;
                  auVar72._12_4_ = 0x7f800000;
                  auVar43 = vblendmps_avx512vl(auVar72,auVar73._0_16_);
                  auVar45._0_4_ =
                       (uint)(bVar18 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
                  bVar8 = (bool)(bVar18 >> 1 & 1);
                  auVar45._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)(bVar18 >> 2 & 1);
                  auVar45._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)(bVar18 >> 3 & 1);
                  auVar45._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * 0x7f800000;
                  auVar43 = vshufps_avx(auVar45,auVar45,0xb1);
                  auVar43 = vminps_avx(auVar43,auVar45);
                  auVar44 = vshufpd_avx(auVar43,auVar43,1);
                  auVar43 = vminps_avx(auVar44,auVar43);
                  uVar16 = vcmpps_avx512vl(auVar45,auVar43,0);
                  bVar23 = (byte)uVar16 & bVar18;
                } while( true );
              }
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != local_25a0);
        }
        fVar69 = (ray->super_RayK<1>).tfar;
        auVar73 = ZEXT3264(CONCAT428(fVar69,CONCAT424(fVar69,CONCAT420(fVar69,CONCAT416(fVar69,
                                                  CONCAT412(fVar69,CONCAT48(fVar69,CONCAT44(fVar69,
                                                  fVar69))))))));
        auVar74 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar79 = ZEXT3264(local_2398);
        auVar81 = ZEXT3264(local_23b8);
        auVar83 = ZEXT3264(local_23d8);
        auVar85 = ZEXT3264(local_23f8);
        auVar86 = ZEXT3264(_DAT_01fe9900);
        auVar87 = ZEXT3264(CONCAT428(0xfffffff8,
                                     CONCAT424(0xfffffff8,
                                               CONCAT420(0xfffffff8,
                                                         CONCAT416(0xfffffff8,
                                                                   CONCAT412(0xfffffff8,
                                                                             CONCAT48(0xfffffff8,
                                                                                                                                                                            
                                                  0xfffffff8fffffff8)))))));
        lVar26 = local_25b0;
      }
LAB_01f1f94c:
    } while (local_25a8 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }